

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebyshevI.cpp
# Opt level: O0

void __thiscall
Iir::ChebyshevI::BandPassBase::setup
          (BandPassBase *this,int order,double centerFrequency,double widthFrequency,double rippleDb
          )

{
  double in_stack_00000020;
  int in_stack_0000002c;
  AnalogLowPass *in_stack_00000030;
  LayoutBase *in_stack_00000090;
  LayoutBase *in_stack_00000098;
  double in_stack_000000a0;
  double in_stack_000000a8;
  BandPassTransform *in_stack_000000b0;
  LayoutBase *in_stack_ffffffffffffffc8;
  Cascade *in_stack_ffffffffffffffd0;
  
  AnalogLowPass::design(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
  BandPassTransform::BandPassTransform
            (in_stack_000000b0,in_stack_000000a8,in_stack_000000a0,in_stack_00000098,
             in_stack_00000090);
  Cascade::setLayout(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

void BandPassBase::setup (int order,
                          double centerFrequency,
                          double widthFrequency,
                          double rippleDb)
{
  m_analogProto.design (order, rippleDb);

  BandPassTransform (centerFrequency,
                     widthFrequency,
                     m_digitalProto,
                     m_analogProto);

  Cascade::setLayout (m_digitalProto);
}